

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveXML.h
# Opt level: O2

void __thiscall chrono::ChArchiveInXML::~ChArchiveInXML(ChArchiveInXML *this)

{
  ~ChArchiveInXML(this);
  operator_delete(this,0x102e0);
  return;
}

Assistant:

rapidxml::xml_node<>* GetValueFromNameOrArray(const char* mname)
      {
		  rapidxml::xml_node<>* mnode = level->first_node(mname);
		  if (!mnode) 
			  token_notfound(mname);
		  return mnode;
		  /*
          rapidjson::Value* mval;
          if (this->is_array.top() == true) {
              if (!level->IsArray()) {throw (ChExceptionArchive( "Cannot retrieve from ID num in non-array object."));}
              mval = &(*level)[this->array_index.top()];
          } else {
              if (level->HasMember(mname))
                  mval = &(*level)[mname];
              else { token_notfound(mname);}
          }
          return mval;
		  */
      }